

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O2

_Bool nni_taskq_drain(nni_taskq *tq)

{
  int iVar1;
  _Bool _Var2;
  
  nni_mtx_lock(&tq->tq_mtx);
  _Var2 = false;
  while( true ) {
    iVar1 = nni_list_empty(&tq->tq_tasks);
    if (iVar1 != 0) break;
    nni_cv_wait(&tq->tq_wait_cv);
    _Var2 = true;
  }
  nni_mtx_unlock(&tq->tq_mtx);
  return _Var2;
}

Assistant:

bool
nni_taskq_drain(nni_taskq *tq)
{
	bool result = false;
	nni_mtx_lock(&tq->tq_mtx);
	while (!nni_list_empty(&tq->tq_tasks)) {
		result = true;
		nni_cv_wait(&tq->tq_wait_cv);
	}
	nni_mtx_unlock(&tq->tq_mtx);
	return (result);
}